

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  string sub_delimiter;
  DynamicMessageFactory factory;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  DynamicMessageFactory local_a0;
  MessageLite *this_00;
  
  DynamicMessageFactory::DynamicMessageFactory(&local_a0);
  pMVar3 = DynamicMessageFactory::GetPrototype(&local_a0,value_descriptor);
  if (pMVar3 == (Message *)0x0) {
    bVar1 = false;
    goto LAB_003b0989;
  }
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3,0);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_120);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_c0,(string *)&local_120);
    bVar1 = ConsumeMessage(this,(Message *)this_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (!bVar1) goto LAB_003b096f;
    if (this->allow_partial_ == true) {
      bVar1 = true;
      MessageLite::AppendPartialToString(this_00,serialized_value);
    }
    else {
      iVar2 = (*this_00->_vptr_MessageLite[5])(this_00);
      if ((char)iVar2 == '\0') {
        std::operator+(&local_100,"Value of type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(value_descriptor + 8) + 0x20));
        std::operator+(&local_e0,&local_100,
                       "\" stored in google.protobuf.Any has missing required fields");
        ReportError(this,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        goto LAB_003b096f;
      }
      bVar1 = true;
      MessageLite::AppendToString(this_00,serialized_value);
    }
  }
  else {
LAB_003b096f:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_120);
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
LAB_003b0989:
  DynamicMessageFactory::~DynamicMessageFactory(&local_a0);
  return bVar1;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(
            "Value of type \"" + value_descriptor->full_name() +
            "\" stored in google.protobuf.Any has missing required fields");
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }